

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::Render(void)

{
  ImVec2 *lhs;
  ImVec2 *uv_a;
  ImVec2 *uv_b;
  ImGuiWindow *window_00;
  ImGuiContext *pIVar1;
  ImTextureID pvVar2;
  bool bVar3;
  value_type *ppIVar4;
  ImVec2 *local_120;
  ImGuiWindow *local_118;
  ImVec2 local_10c;
  ImVec2 local_104;
  ImVec2 local_fc;
  ImVec2 local_f4;
  ImVec2 local_ec;
  ImVec2 local_e4;
  ImVec2 local_dc;
  ImVec2 local_d4;
  ImVec2 local_cc;
  ImVec2 local_c4;
  ImVec2 local_bc;
  ImVec2 local_b4;
  ImVec2 local_ac;
  ImVec2 local_a4;
  ImVec2 local_9c;
  ImVec2 local_94;
  ImVec2 local_8c;
  ImVec2 local_84;
  ImVec2 local_7c;
  ImVec2 local_74;
  float local_6c;
  ImTextureID pvStack_68;
  float sc;
  ImTextureID tex_id;
  ImVec2 pos;
  ImVec2 uv [4];
  ImVec2 size;
  ImVec2 offset;
  ImGuiWindow *window;
  int n;
  ImGuiWindow *window_to_render_front_most;
  ImGuiContext *g;
  
  pIVar1 = GImGui;
  if ((GImGui->Initialized & 1U) == 0) {
    __assert_fail("g.Initialized",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sreiter[P]lumeview/deps/imgui/imgui.cpp"
                  ,0x100e,"void ImGui::Render()");
  }
  if (GImGui->FrameCountEnded != GImGui->FrameCount) {
    EndFrame();
  }
  pIVar1->FrameCountRendered = pIVar1->FrameCount;
  (pIVar1->IO).MetricsActiveWindows = 0;
  (pIVar1->IO).MetricsRenderIndices = 0;
  (pIVar1->IO).MetricsRenderVertices = 0;
  ImDrawDataBuilder::Clear(&pIVar1->DrawDataBuilder);
  if ((pIVar1->NavWindowingTarget == (ImGuiWindow *)0x0) ||
     ((pIVar1->NavWindowingTarget->Flags & 0x2000U) != 0)) {
    local_118 = (ImGuiWindow *)0x0;
  }
  else {
    local_118 = pIVar1->NavWindowingTarget;
  }
  for (window._4_4_ = 0; window._4_4_ != (pIVar1->Windows).Size; window._4_4_ = window._4_4_ + 1) {
    ppIVar4 = ImVector<ImGuiWindow_*>::operator[](&pIVar1->Windows,window._4_4_);
    window_00 = *ppIVar4;
    if (((((window_00->Active & 1U) != 0) && (window_00->HiddenFrames == 0)) &&
        ((window_00->Flags & 0x1000000U) == 0)) && (window_00 != local_118)) {
      AddWindowToDrawDataSelectLayer(window_00);
    }
  }
  if (((local_118 != (ImGuiWindow *)0x0) && ((local_118->Active & 1U) != 0)) &&
     (local_118->HiddenFrames == 0)) {
    AddWindowToDrawDataSelectLayer(local_118);
  }
  ImDrawDataBuilder::FlattenIntoSingleLayer(&pIVar1->DrawDataBuilder);
  ImVec2::ImVec2(&size);
  ImVec2::ImVec2(uv + 3);
  local_120 = &pos;
  do {
    ImVec2::ImVec2(local_120);
    local_120 = local_120 + 1;
  } while (local_120 != uv + 3);
  if ((((pIVar1->IO).MouseDrawCursor & 1U) != 0) &&
     (bVar3 = ImFontAtlas::GetMouseCursorTexData
                        ((pIVar1->IO).Fonts,pIVar1->MouseCursor,&size,uv + 3,&pos,uv + 1), bVar3)) {
    tex_id = (ImTextureID)::operator-(&(pIVar1->IO).MousePos,&size);
    pvStack_68 = ((pIVar1->IO).Fonts)->TexID;
    local_6c = (pIVar1->Style).MouseCursorScale;
    ImDrawList::PushTextureID(&pIVar1->OverlayDrawList,pvStack_68);
    pvVar2 = pvStack_68;
    ImVec2::ImVec2(&local_84,1.0,0.0);
    local_7c = ::operator*(&local_84,local_6c);
    local_74 = operator+((ImVec2 *)&tex_id,&local_7c);
    ImVec2::ImVec2(&local_a4,1.0,0.0);
    local_9c = ::operator*(&local_a4,local_6c);
    local_94 = operator+((ImVec2 *)&tex_id,&local_9c);
    lhs = uv + 3;
    local_ac = ::operator*(lhs,local_6c);
    local_8c = operator+(&local_94,&local_ac);
    uv_a = uv + 1;
    uv_b = uv + 2;
    ImDrawList::AddImage(&pIVar1->OverlayDrawList,pvVar2,&local_74,&local_8c,uv_a,uv_b,0x30000000);
    pvVar2 = pvStack_68;
    ImVec2::ImVec2(&local_c4,2.0,0.0);
    local_bc = ::operator*(&local_c4,local_6c);
    local_b4 = operator+((ImVec2 *)&tex_id,&local_bc);
    ImVec2::ImVec2(&local_e4,2.0,0.0);
    local_dc = ::operator*(&local_e4,local_6c);
    local_d4 = operator+((ImVec2 *)&tex_id,&local_dc);
    local_ec = ::operator*(lhs,local_6c);
    local_cc = operator+(&local_d4,&local_ec);
    ImDrawList::AddImage(&pIVar1->OverlayDrawList,pvVar2,&local_b4,&local_cc,uv_a,uv_b,0x30000000);
    pvVar2 = pvStack_68;
    local_fc = ::operator*(lhs,local_6c);
    local_f4 = operator+((ImVec2 *)&tex_id,&local_fc);
    ImDrawList::AddImage
              (&pIVar1->OverlayDrawList,pvVar2,(ImVec2 *)&tex_id,&local_f4,uv_a,uv_b,0xff000000);
    pvVar2 = pvStack_68;
    local_10c = ::operator*(lhs,local_6c);
    local_104 = operator+((ImVec2 *)&tex_id,&local_10c);
    ImDrawList::AddImage
              (&pIVar1->OverlayDrawList,pvVar2,(ImVec2 *)&tex_id,&local_104,&pos,uv,0xffffffff);
    ImDrawList::PopTextureID(&pIVar1->OverlayDrawList);
  }
  bVar3 = ImVector<ImDrawVert>::empty(&(pIVar1->OverlayDrawList).VtxBuffer);
  if (!bVar3) {
    AddDrawListToDrawData((pIVar1->DrawDataBuilder).Layers,&pIVar1->OverlayDrawList);
  }
  SetupDrawData((pIVar1->DrawDataBuilder).Layers,&pIVar1->DrawData);
  (pIVar1->IO).MetricsRenderVertices = (pIVar1->DrawData).TotalVtxCount;
  (pIVar1->IO).MetricsRenderIndices = (pIVar1->DrawData).TotalIdxCount;
  if ((0 < (pIVar1->DrawData).CmdListsCount) &&
     ((pIVar1->IO).RenderDrawListsFn != (_func_void_ImDrawData_ptr *)0x0)) {
    (*(pIVar1->IO).RenderDrawListsFn)(&pIVar1->DrawData);
  }
  return;
}

Assistant:

void ImGui::Render()
{
    ImGuiContext& g = *GImGui;
    IM_ASSERT(g.Initialized);   // Forgot to call ImGui::NewFrame()

    if (g.FrameCountEnded != g.FrameCount)
        ImGui::EndFrame();
    g.FrameCountRendered = g.FrameCount;

    // Gather windows to render
    g.IO.MetricsRenderVertices = g.IO.MetricsRenderIndices = g.IO.MetricsActiveWindows = 0;
    g.DrawDataBuilder.Clear();
    ImGuiWindow* window_to_render_front_most = (g.NavWindowingTarget && !(g.NavWindowingTarget->Flags & ImGuiWindowFlags_NoBringToFrontOnFocus)) ? g.NavWindowingTarget : NULL;
    for (int n = 0; n != g.Windows.Size; n++)
    {
        ImGuiWindow* window = g.Windows[n];
        if (window->Active && window->HiddenFrames == 0 && (window->Flags & ImGuiWindowFlags_ChildWindow) == 0 && window != window_to_render_front_most)
            AddWindowToDrawDataSelectLayer(window);
    }
    if (window_to_render_front_most && window_to_render_front_most->Active && window_to_render_front_most->HiddenFrames == 0) // NavWindowingTarget is always temporarily displayed as the front-most window
        AddWindowToDrawDataSelectLayer(window_to_render_front_most);
    g.DrawDataBuilder.FlattenIntoSingleLayer();

    // Draw software mouse cursor if requested
    ImVec2 offset, size, uv[4];
    if (g.IO.MouseDrawCursor && g.IO.Fonts->GetMouseCursorTexData(g.MouseCursor, &offset, &size, &uv[0], &uv[2]))
    {
        const ImVec2 pos = g.IO.MousePos - offset;
        const ImTextureID tex_id = g.IO.Fonts->TexID;
        const float sc = g.Style.MouseCursorScale;
        g.OverlayDrawList.PushTextureID(tex_id);
        g.OverlayDrawList.AddImage(tex_id, pos + ImVec2(1,0)*sc, pos+ImVec2(1,0)*sc + size*sc, uv[2], uv[3], IM_COL32(0,0,0,48));        // Shadow
        g.OverlayDrawList.AddImage(tex_id, pos + ImVec2(2,0)*sc, pos+ImVec2(2,0)*sc + size*sc, uv[2], uv[3], IM_COL32(0,0,0,48));        // Shadow
        g.OverlayDrawList.AddImage(tex_id, pos,                  pos + size*sc,                uv[2], uv[3], IM_COL32(0,0,0,255));       // Black border
        g.OverlayDrawList.AddImage(tex_id, pos,                  pos + size*sc,                uv[0], uv[1], IM_COL32(255,255,255,255)); // White fill
        g.OverlayDrawList.PopTextureID();
    }
    if (!g.OverlayDrawList.VtxBuffer.empty())
        AddDrawListToDrawData(&g.DrawDataBuilder.Layers[0], &g.OverlayDrawList);

    // Setup ImDrawData structure for end-user
    SetupDrawData(&g.DrawDataBuilder.Layers[0], &g.DrawData);
    g.IO.MetricsRenderVertices = g.DrawData.TotalVtxCount;
    g.IO.MetricsRenderIndices = g.DrawData.TotalIdxCount;

    // Render. If user hasn't set a callback then they may retrieve the draw data via GetDrawData()
#ifndef IMGUI_DISABLE_OBSOLETE_FUNCTIONS
    if (g.DrawData.CmdListsCount > 0 && g.IO.RenderDrawListsFn != NULL)
        g.IO.RenderDrawListsFn(&g.DrawData);
#endif
}